

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall amrex::MLEBABecLap::normalize(MLEBABecLap *this,int amrlev,int mglev,MultiFab *mf)

{
  FabArray<amrex::FArrayBox> *this_00;
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  uint ncomp;
  FabType FVar8;
  long lVar9;
  EBFArrayBoxFactory *this_01;
  int *piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  Real dhx;
  MFIter mfi;
  Box tbx;
  FabArray<amrex::EBCellFlagFab> *local_ba0;
  double local_b88;
  undefined1 local_b58 [16];
  MultiCutFab *local_b40;
  MultiCutFab *local_b38;
  FabArray<amrex::FArrayBox> *local_b30;
  long local_b10;
  Box local_b04;
  double local_ae8;
  double dStack_ae0;
  undefined1 local_ad8 [16];
  Array<const_MultiCutFab_*,_3> local_ac8;
  Array<const_MultiCutFab_*,_3> local_aa8;
  long local_a88;
  long local_a80;
  _Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> local_a78;
  FabArray<amrex::IArrayBox> *local_a70;
  FabArray<amrex::FArrayBox> *local_a68;
  FabArray<amrex::FArrayBox> *local_a60;
  ulong local_a58;
  long local_a50;
  long local_a48;
  long local_a40;
  ulong local_a38;
  long local_a30;
  long local_a28;
  long local_a20;
  long local_a18;
  long local_a10;
  long local_a08;
  long local_a00;
  long local_9f8;
  long local_9f0;
  long local_9e8;
  long local_9e0;
  undefined1 local_9d8 [16];
  Array4<const_double> local_9c8;
  Array4<const_double> local_988;
  Array4<const_double> local_948;
  Array4<double> local_908;
  Array4<const_double> local_8c8;
  Array4<const_double> local_888;
  undefined1 local_848 [16];
  undefined8 local_838;
  undefined8 uStack_830;
  double *local_828;
  Long LStack_820;
  Long local_818;
  Long LStack_810;
  MFIter local_808;
  Box local_7a8;
  Array4<const_double> local_780;
  Array4<const_double> local_740;
  Array4<const_double> local_700;
  Array4<const_double> local_6c0;
  Array4<const_double> local_680;
  Array4<const_double> local_640;
  Array4<const_double> local_600;
  Array4<const_double> local_5c0;
  Array4<const_double> local_580;
  Array4<const_amrex::EBCellFlag> local_540;
  Array4<const_int> local_500;
  MFItInfo local_4bc;
  anon_class_1136_23_0525a3f5 local_4a8;
  
  lVar9 = (long)amrlev;
  local_a80 = lVar9 * 0x18;
  local_a88 = (long)mglev;
  local_a60 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->m_a_coeffs).
                         super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar9].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
              local_a88 * 0x180);
  lVar17 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  lVar19 = local_a88 * 0x480;
  this_00 = (FabArray<amrex::FArrayBox> *)(lVar17 + lVar19);
  local_a70 = (FabArray<amrex::IArrayBox> *)
              (local_a88 * 0x180 +
              *(long *)&(this->m_cc_mask).
                        super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar9].
                        super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                        super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>);
  lVar4 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  dVar2 = *(double *)(lVar4 + 0x38 + local_a88 * 200);
  dVar3 = this->m_b_scalar;
  dVar6 = dVar2 * dVar3 * dVar2;
  pdVar1 = (double *)(lVar4 + 0x40 + local_a88 * 200);
  local_ae8 = *pdVar1;
  dStack_ae0 = pdVar1[1];
  dVar5 = dVar3 * dStack_ae0 * dStack_ae0;
  local_ad8._8_4_ = SUB84(dVar5,0);
  local_ad8._0_8_ = dVar3 * local_ae8 * local_ae8;
  local_ad8._12_4_ = (int)((ulong)dVar5 >> 0x20);
  lVar4 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar9].
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                   + local_a88 * 8);
  if ((lVar4 == 0) ||
     (this_01 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0),
     this_01 == (EBFArrayBoxFactory *)0x0)) {
    local_aa8._M_elems[2] = (MultiCutFab *)0x0;
    local_ac8._M_elems[2] = (MultiCutFab *)0x0;
    local_aa8._M_elems[0] = (MultiCutFab *)0x0;
    local_aa8._M_elems[1] = (MultiCutFab *)0x0;
    local_ac8._M_elems[0] = (MultiCutFab *)0x0;
    local_ac8._M_elems[1] = (MultiCutFab *)0x0;
    local_b38 = (MultiCutFab *)0x0;
    local_ba0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_b30 = (FabArray<amrex::FArrayBox> *)0x0;
    local_b40 = (MultiCutFab *)0x0;
    local_b58 = local_ad8;
    local_b88 = dVar6;
  }
  else {
    local_ba0 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    local_b30 = &EBFArrayBoxFactory::getVolFrac(this_01)->super_FabArray<amrex::FArrayBox>;
    EBFArrayBoxFactory::getAreaFrac(&local_aa8,this_01);
    EBFArrayBoxFactory::getFaceCent(&local_ac8,this_01);
    local_b38 = EBFArrayBoxFactory::getBndryArea(this_01);
    local_b40 = EBFArrayBoxFactory::getBndryCent(this_01);
    dVar3 = this->m_b_scalar;
    dVar5 = dVar3 * dStack_ae0 * dStack_ae0;
    local_b58._8_4_ = SUB84(dVar5,0);
    local_b58._0_8_ = dVar3 * local_ae8 * local_ae8;
    local_b58._12_4_ = (int)((ulong)dVar5 >> 0x20);
    local_b88 = dVar2 * dVar3 * dVar2;
  }
  local_a68 = (FabArray<amrex::FArrayBox> *)(lVar17 + lVar19 + 0x300);
  local_a78.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       *(_Head_base<0UL,_amrex::MultiFab_*,_false> *)
        &(((this->m_eb_phi).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  bVar20 = local_a78.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0
  ;
  local_828 = (double *)0x0;
  LStack_820 = 0;
  local_818 = 0;
  LStack_810 = 0;
  local_838 = 0;
  uStack_830._0_4_ = 0;
  uStack_830._4_4_ = 0;
  dVar2 = this->m_a_scalar;
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_4bc.device_sync = true;
  local_4bc.num_streams = Gpu::Device::max_gpu_streams;
  local_4bc.do_tiling = true;
  local_4bc.dynamic = false;
  local_4bc.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_4bc.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_4bc.tilesize.vect[2] = DAT_007d7ef0;
  MFIter::MFIter(&local_808,(FabArrayBase *)mf,&local_4bc);
  uVar7 = ncomp;
  if ((int)ncomp < 1) {
    uVar7 = 0;
  }
  local_a58 = (ulong)uVar7;
  local_848._8_4_ = local_ad8._8_4_;
  local_848._0_8_ = local_ad8._8_8_;
  local_848._12_4_ = local_ad8._12_4_;
  local_9d8._8_4_ = local_b58._8_4_;
  local_9d8._0_8_ = local_b58._8_8_;
  local_9d8._12_4_ = local_b58._12_4_;
  do {
    if (local_808.endIndex <= local_808.currentIndex) {
      MFIter::~MFIter(&local_808);
      return;
    }
    MFIter::tilebox(&local_b04,&local_808);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_908,&mf->super_FabArray<amrex::FArrayBox>,&local_808);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_8c8,local_a60,&local_808);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_948,this_00,&local_808);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_988,this_00 + 1,&local_808);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_9c8,local_a68,&local_808);
    if (local_ba0 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_0066d807:
      local_a40 = (long)local_b04.smallend.vect[1];
      local_a50 = (long)local_b04.smallend.vect[2];
      local_a48 = (long)local_b04.smallend.vect[0] * 8;
      local_b10 = 0;
      for (local_a38 = 0; lVar17 = local_a50, iVar18 = local_b04.smallend.vect[2],
          local_a38 != local_a58; local_a38 = local_a38 + 1) {
        while (iVar18 = iVar18 + 1, (int)lVar17 <= local_b04.bigend.vect[2]) {
          local_9e0 = (long)local_8c8.begin.y;
          local_9e8 = (long)local_948.begin.y;
          local_9f0 = (long)local_988.begin.y;
          local_9f8 = (long)local_9c8.begin.y;
          local_a00 = (long)local_948.p +
                      local_948.nstride * local_b10 +
                      (lVar17 - local_948.begin.z) * local_948.kstride * 8 +
                      (long)local_948.begin.x * -8 + local_a48;
          lVar4 = local_988.nstride * local_b10 +
                  (lVar17 - local_988.begin.z) * local_988.kstride * 8 +
                  (long)local_988.begin.x * -8 + local_a48;
          local_a10 = (long)local_9c8.p +
                      (long)(iVar18 - local_9c8.begin.z) * local_9c8.kstride * 8 +
                      local_9c8.nstride * local_b10 + (long)local_9c8.begin.x * -8 + local_a48;
          local_a08 = (long)local_9c8.p +
                      (lVar17 - local_9c8.begin.z) * local_9c8.kstride * 8 +
                      local_9c8.nstride * local_b10 + (long)local_9c8.begin.x * -8 + local_a48;
          local_a18 = (long)local_908.p +
                      local_908.nstride * local_b10 +
                      (lVar17 - local_908.begin.z) * local_908.kstride * 8 +
                      (long)local_908.begin.x * -8 + local_a48;
          local_a30 = lVar17 + 1;
          lVar19 = lVar17 - local_8c8.begin.z;
          local_ae8 = (double)(local_948.jstride * 8);
          local_a20 = local_9c8.jstride * 8;
          local_a28 = (long)local_908.begin.y;
          lVar9 = local_a40;
          while (lVar17 = local_a30, lVar9 <= local_b04.bigend.vect[1]) {
            if (local_b04.bigend.vect[0] < local_b04.smallend.vect[0]) {
              lVar9 = lVar9 + 1;
            }
            else {
              lVar13 = lVar9 - local_9e0;
              lVar16 = (lVar9 - local_9e8) * (long)local_ae8 + local_a00;
              lVar15 = lVar9 - local_9f0;
              lVar17 = lVar9 + 1;
              lVar12 = (lVar9 - local_9f8) * local_a20;
              lVar11 = (lVar9 - local_a28) * local_908.jstride * 8 + local_a18;
              lVar14 = 0;
              do {
                *(double *)(lVar11 + lVar14 * 8) =
                     *(double *)(lVar11 + lVar14 * 8) /
                     ((*(double *)(lVar12 + local_a08 + lVar14 * 8) +
                      *(double *)(local_a10 + lVar12 + lVar14 * 8)) * (double)local_9d8._0_8_ +
                     (*(double *)
                       ((long)local_988.p + lVar14 * 8 + lVar15 * local_988.jstride * 8 + lVar4) +
                     *(double *)
                      ((long)local_988.p +
                      lVar14 * 8 +
                      (long)((int)lVar17 - local_988.begin.y) * local_988.jstride * 8 + lVar4)) *
                     (double)local_b58._0_8_ +
                     *(double *)
                      ((long)local_8c8.p +
                      lVar14 * 8 +
                      lVar13 * local_8c8.jstride * 8 +
                      lVar19 * local_8c8.kstride * 8 + (long)local_8c8.begin.x * -8 + local_a48) *
                     dVar2 + (*(double *)(lVar16 + lVar14 * 8) +
                             *(double *)(lVar16 + 8 + lVar14 * 8)) * local_b88);
                lVar14 = lVar14 + 1;
                lVar9 = lVar17;
              } while ((local_b04.bigend.vect[0] - local_b04.smallend.vect[0]) + 1 != (int)lVar14);
            }
          }
        }
        local_b10 = local_b10 + 8;
      }
    }
    else {
      piVar10 = &local_808.currentIndex;
      if (local_808.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar10 = ((local_808.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_808.currentIndex;
      }
      FVar8 = EBCellFlagFab::getType
                        ((local_ba0->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar10],&local_b04);
      if (FVar8 == singlevalued) {
        if (local_a78.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl ==
            (MultiFab *)0x0) {
          local_888.kstride = local_818;
          local_888.nstride = LStack_810;
          local_888.p = local_828;
          local_888.jstride = LStack_820;
          local_888.begin.x = 1;
          local_888.begin.y = 1;
          local_888.begin.z = 1;
          local_888.end.x = (int)local_838;
          local_888.end.y = (int)((ulong)local_838 >> 0x20);
          local_888.end.z = (int)uStack_830;
          local_888.ncomp = uStack_830._4_4_;
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_888,
                     *(FabArray<amrex::FArrayBox> **)
                      (*(long *)((long)&(((this->m_eb_b_coeffs).
                                          super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                        ).
                                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + local_a80) +
                      local_a88 * 8),&local_808);
        }
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_500,local_a70,&local_808);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_540,local_ba0,&local_808);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_580,local_b30,&local_808);
        MultiCutFab::const_array(&local_5c0,local_aa8._M_elems[0],&local_808);
        MultiCutFab::const_array(&local_600,local_aa8._M_elems[1],&local_808);
        MultiCutFab::const_array(&local_640,local_aa8._M_elems[2],&local_808);
        MultiCutFab::const_array(&local_680,local_ac8._M_elems[0],&local_808);
        MultiCutFab::const_array(&local_6c0,local_ac8._M_elems[1],&local_808);
        MultiCutFab::const_array(&local_700,local_ac8._M_elems[2],&local_808);
        MultiCutFab::const_array(&local_740,local_b38,&local_808);
        MultiCutFab::const_array(&local_780,local_b40,&local_808);
        local_4a8.beta_on_centroid = this->m_beta_loc == FaceCentroid;
        local_4a8.flag.end.z = local_540.end.z;
        local_4a8.flag.ncomp = local_540.ncomp;
        local_4a8.flag.begin.x = local_540.begin.x;
        local_4a8.flag.begin.y = local_540.begin.y;
        local_4a8.flag.kstride = local_540.kstride;
        local_4a8.flag.nstride = local_540.nstride;
        local_4a8.flag.p = local_540.p;
        local_4a8.flag.jstride = local_540.jstride;
        local_4a8.phi.end.z = local_908.end.z;
        local_4a8.phi.ncomp = local_908.ncomp;
        local_4a8.phi.kstride = local_908.kstride;
        local_4a8.phi.nstride = local_908.nstride;
        local_4a8.phi.p = local_908.p;
        local_4a8.phi.jstride = local_908.jstride;
        local_4a8.a.end.z = local_8c8.end.z;
        local_4a8.a.ncomp = local_8c8.ncomp;
        local_4a8.a.kstride = local_8c8.kstride;
        local_4a8.a.nstride = local_8c8.nstride;
        local_4a8.a.p = local_8c8.p;
        local_4a8.a.jstride = local_8c8.jstride;
        local_4a8.bX.end.z = local_948.end.z;
        local_4a8.bX.ncomp = local_948.ncomp;
        local_4a8.bX.kstride = local_948.kstride;
        local_4a8.bX.nstride = local_948.nstride;
        local_4a8.bX.p = local_948.p;
        local_4a8.bX.jstride = local_948.jstride;
        local_4a8.dhy = (Real)local_ad8._0_8_;
        local_4a8.bY.end.z = local_988.end.z;
        local_4a8.bY.ncomp = local_988.ncomp;
        local_4a8.bY.kstride = local_988.kstride;
        local_4a8.bY.nstride = local_988.nstride;
        local_4a8.bY.p = local_988.p;
        local_4a8.bY.jstride = local_988.jstride;
        local_4a8.dhz = (Real)local_848._0_8_;
        local_4a8.bZ.end.z = local_9c8.end.z;
        local_4a8.bZ.ncomp = local_9c8.ncomp;
        local_4a8.bZ.kstride = local_9c8.kstride;
        local_4a8.bZ.nstride = local_9c8.nstride;
        local_4a8.bZ.p = local_9c8.p;
        local_4a8.bZ.jstride = local_9c8.jstride;
        local_4a8.vfrc.end.z = local_580.end.z;
        local_4a8.vfrc.ncomp = local_580.ncomp;
        local_4a8.vfrc.begin.x = local_580.begin.x;
        local_4a8.vfrc.begin.y = local_580.begin.y;
        local_4a8.vfrc.kstride = local_580.kstride;
        local_4a8.vfrc.nstride = local_580.nstride;
        local_4a8.vfrc.p = local_580.p;
        local_4a8.vfrc.jstride = local_580.jstride;
        local_4a8.apx.end.z = local_5c0.end.z;
        local_4a8.apx.ncomp = local_5c0.ncomp;
        local_4a8.apx.begin.x = local_5c0.begin.x;
        local_4a8.apx.begin.y = local_5c0.begin.y;
        local_4a8.apx.kstride = local_5c0.kstride;
        local_4a8.apx.nstride = local_5c0.nstride;
        local_4a8.apx.p = local_5c0.p;
        local_4a8.apx.jstride = local_5c0.jstride;
        local_4a8.apy.end.z = local_600.end.z;
        local_4a8.apy.ncomp = local_600.ncomp;
        local_4a8.apy.begin.x = local_600.begin.x;
        local_4a8.apy.begin.y = local_600.begin.y;
        local_4a8.apy.kstride = local_600.kstride;
        local_4a8.apy.nstride = local_600.nstride;
        local_4a8.apy.p = local_600.p;
        local_4a8.apy.jstride = local_600.jstride;
        local_4a8.apz.end.z = local_640.end.z;
        local_4a8.apz.ncomp = local_640.ncomp;
        local_4a8.apz.begin.x = local_640.begin.x;
        local_4a8.apz.begin.y = local_640.begin.y;
        local_4a8.apz.kstride = local_640.kstride;
        local_4a8.apz.nstride = local_640.nstride;
        local_4a8.apz.p = local_640.p;
        local_4a8.apz.jstride = local_640.jstride;
        local_4a8.fcx.end.z = local_680.end.z;
        local_4a8.fcx.ncomp = local_680.ncomp;
        local_4a8.fcx.begin.x = local_680.begin.x;
        local_4a8.fcx.begin.y = local_680.begin.y;
        local_4a8.fcx.kstride = local_680.kstride;
        local_4a8.fcx.nstride = local_680.nstride;
        local_4a8.fcx.p = local_680.p;
        local_4a8.fcx.jstride = local_680.jstride;
        local_4a8.ccm.end.z = local_500.end.z;
        local_4a8.ccm.ncomp = local_500.ncomp;
        local_4a8.ccm.begin.x = local_500.begin.x;
        local_4a8.ccm.begin.y = local_500.begin.y;
        local_4a8.ccm.kstride = local_500.kstride;
        local_4a8.ccm.nstride = local_500.nstride;
        local_4a8.ccm.p = local_500.p;
        local_4a8.ccm.jstride = local_500.jstride;
        local_4a8.fcy.end.z = local_6c0.end.z;
        local_4a8.fcy.ncomp = local_6c0.ncomp;
        local_4a8.fcy.begin.x = local_6c0.begin.x;
        local_4a8.fcy.begin.y = local_6c0.begin.y;
        local_4a8.fcy.kstride = local_6c0.kstride;
        local_4a8.fcy.nstride = local_6c0.nstride;
        local_4a8.fcy.p = local_6c0.p;
        local_4a8.fcy.jstride = local_6c0.jstride;
        local_4a8.fcz.end.z = local_700.end.z;
        local_4a8.fcz.ncomp = local_700.ncomp;
        local_4a8.fcz.begin.x = local_700.begin.x;
        local_4a8.fcz.begin.y = local_700.begin.y;
        local_4a8.fcz.kstride = local_700.kstride;
        local_4a8.fcz.nstride = local_700.nstride;
        local_4a8.fcz.p = local_700.p;
        local_4a8.fcz.jstride = local_700.jstride;
        local_4a8.bc.end.z = local_780.end.z;
        local_4a8.bc.ncomp = local_780.ncomp;
        local_4a8.bc.begin.x = local_780.begin.x;
        local_4a8.bc.begin.y = local_780.begin.y;
        local_4a8.bc.kstride = local_780.kstride;
        local_4a8.bc.nstride = local_780.nstride;
        local_4a8.bc.p = local_780.p;
        local_4a8.bc.jstride = local_780.jstride;
        local_4a8.ba.end.z = local_740.end.z;
        local_4a8.ba.ncomp = local_740.ncomp;
        local_4a8.ba.begin.x = local_740.begin.x;
        local_4a8.ba.begin.y = local_740.begin.y;
        local_4a8.ba.kstride = local_740.kstride;
        local_4a8.ba.nstride = local_740.nstride;
        local_4a8.ba.p = local_740.p;
        local_4a8.ba.jstride = local_740.jstride;
        local_4a8.beb.end.y = local_888.end.y;
        local_4a8.beb.end.z = local_888.end.z;
        local_4a8.beb.ncomp = local_888.ncomp;
        local_4a8.beb.begin.x = local_888.begin.x;
        local_4a8.beb.begin.y = local_888.begin.y;
        local_4a8.beb.begin.z = local_888.begin.z;
        local_4a8.beb.end.x = local_888.end.x;
        local_4a8.beb.kstride = local_888.kstride;
        local_4a8.beb.nstride = local_888.nstride;
        local_4a8.beb.p = local_888.p;
        local_4a8.beb.jstride = local_888.jstride;
        local_4a8.alpha = dVar2;
        local_4a8.dhx = dVar6;
        local_4a8.is_dirichlet = bVar20;
        Loop<amrex::mlebabeclap_normalize(amrex::Box_const&,amrex::Array4<double>const&,double,amrex::Array4<double_const>const&,double,double,double,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,bool,bool,int)::_lambda(int,int,int,int)_1_>
                  (&local_7a8,ncomp,&local_4a8);
      }
      else if (FVar8 == regular) goto LAB_0066d807;
    }
    MFIter::operator++(&local_808);
  } while( true );
}

Assistant:

void
MLEBABecLap::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    const auto dxinvarray = m_geom[amrlev][mglev].InvCellSizeArray();
    AMREX_D_TERM(Real dhx = m_b_scalar*dxinvarray[0]*dxinvarray[0];,
                 Real dhy = m_b_scalar*dxinvarray[1]*dxinvarray[1];,
                 Real dhz = m_b_scalar*dxinvarray[2]*dxinvarray[2];);

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;

    bool is_eb_dirichlet =  isEBDirichlet();

    Array4<Real const> foo;

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;
    const int ncomp = getNComp();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& fab = mf.array(mfi);
        Array4<Real const> const& afab = acoef.const_array(mfi);
        AMREX_D_TERM(Array4<Real const> const& bxfab = bxcoef.const_array(mfi);,
                     Array4<Real const> const& byfab = bycoef.const_array(mfi);,
                     Array4<Real const> const& bzfab = bzcoef.const_array(mfi););

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        if (fabtyp == FabType::regular)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                mlabeclap_normalize(i,j,k,n, fab, afab, AMREX_D_DECL(bxfab, byfab, bzfab),
                                    dxinvarray, ascalar, bscalar);
            });
        }
        else if (fabtyp == FabType::singlevalued)
        {
            Array4<Real const> const& bebfab
                = (is_eb_dirichlet) ? m_eb_b_coeffs[amrlev][mglev]->const_array(mfi) : foo;
            Array4<int const> const& ccmfab = ccmask.const_array(mfi);
            Array4<EBCellFlag const> const& flagfab = flags->const_array(mfi);
            Array4<Real const> const& vfracfab = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                         Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                         Array4<Real const> const& apzfab = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcxfab = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcyfab = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fczfab = fcent[2]->const_array(mfi););
            Array4<Real const> const& bafab = barea->const_array(mfi);
            Array4<Real const> const& bcfab = bcent->const_array(mfi);

            bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mlebabeclap_normalize(tbx, fab, ascalar, afab,
                                      AMREX_D_DECL(dhx, dhy, dhz),
                                      AMREX_D_DECL(bxfab, byfab, bzfab),
                                      ccmfab, flagfab, vfracfab,
                                      AMREX_D_DECL(apxfab,apyfab,apzfab),
                                      AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                      bafab, bcfab, bebfab, is_eb_dirichlet,
                                      beta_on_centroid, ncomp);
            });
        }
    }
}